

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<char16_t>::addAll<char16_t*,true>
          (ArrayBuilder<char16_t> *this,char16_t *start,char16_t *end)

{
  char16_t *pcVar1;
  char16_t *end_local;
  char16_t *start_local;
  ArrayBuilder<char16_t> *this_local;
  
  pcVar1 = _::CopyConstructArray_<char16_t,_char16_t_*,_true,_false>::apply(this->pos,start,end);
  this->pos = pcVar1;
  return;
}

Assistant:

void ArrayBuilder<T>::addAll(Iterator start, Iterator end) {
  pos = _::CopyConstructArray_<RemoveConst<T>, Decay<Iterator>, move>::apply(pos, start, end);
}